

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O2

void __thiscall Samba::writeBuffer(Samba *this,uint32_t src_addr,uint32_t dst_addr,uint32_t size)

{
  SerialPort *pSVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  uint8_t cmd [64];
  
  if ((this->_canWriteBuffer != false) && (size < 0x1001)) {
    if (this->_debug == true) {
      printf("%s(scr_addr=%#x, dst_addr=%#x, size=%#x)\n","writeBuffer",(ulong)src_addr,
             (ulong)dst_addr,(ulong)size);
    }
    uVar2 = snprintf((char *)cmd,0x40,"Y%08X,0#",(ulong)src_addr);
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    uVar3 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,cmd,(ulong)uVar2);
    if (uVar3 == uVar2) {
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[9])(pSVar1,100);
      cmd[0] = '\0';
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[5])(pSVar1,cmd,3);
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[9])(pSVar1,1000);
      if (cmd[0] == 'Y') {
        uVar2 = snprintf((char *)cmd,0x40,"Y%08X,%08X#",(ulong)dst_addr,(ulong)size);
        pSVar1 = (this->_port)._M_t.
                 super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                 super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                 super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
        uVar3 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,cmd,(ulong)uVar2);
        if (uVar3 == uVar2) {
          pSVar1 = (this->_port)._M_t.
                   super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                   super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                   super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
          (*pSVar1->_vptr_SerialPort[9])(pSVar1,5000);
          cmd[0] = '\0';
          pSVar1 = (this->_port)._M_t.
                   super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                   super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                   super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
          (*pSVar1->_vptr_SerialPort[5])(pSVar1,cmd,3);
          pSVar1 = (this->_port)._M_t.
                   super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                   super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                   super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
          (*pSVar1->_vptr_SerialPort[9])(pSVar1,1000);
          if (cmd[0] == 'Y') {
            return;
          }
        }
      }
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_001175a0;
  __cxa_throw(puVar4,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

void
Samba::writeBuffer(uint32_t src_addr, uint32_t dst_addr, uint32_t size)
{
    if (!_canWriteBuffer)
        throw SambaError();

    if (size > checksumBufferSize())
        throw SambaError();
            
    if (_debug)
        printf("%s(scr_addr=%#x, dst_addr=%#x, size=%#x)\n", __FUNCTION__, src_addr, dst_addr, size);

    uint8_t cmd[64];
    int l = snprintf((char*) cmd, sizeof(cmd), "Y%08X,0#", src_addr);
    if (_port->write(cmd, l) != l)
        throw SambaError();
    _port->timeout(TIMEOUT_QUICK);
    cmd[0] = 0;
    _port->read(cmd, 3); // Expects "Y\n\r"
    _port->timeout(TIMEOUT_NORMAL);
    if (cmd[0] != 'Y')
        throw SambaError();

    l = snprintf((char*) cmd, sizeof(cmd), "Y%08X,%08X#", dst_addr, size);
    if (_port->write(cmd, l) != l)
        throw SambaError();
    _port->timeout(TIMEOUT_LONG);
    cmd[0] = 0;
    _port->read(cmd, 3); // Expects "Y\n\r"
    _port->timeout(TIMEOUT_NORMAL);
    if (cmd[0] != 'Y')
        throw SambaError();
}